

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O1

void Iso_ManObjCount_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int *pnNodes,int *pnEdges)

{
  if (((*(uint *)&pObj->field_0x18 & 7) != 2) && (pObj->TravId != p->nTravIds)) {
    pObj->TravId = p->nTravIds;
    Iso_ManObjCount_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pnNodes,pnEdges);
    Iso_ManObjCount_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pnNodes,pnEdges);
    *pnEdges = (*(uint *)&pObj->pFanin0 & 1) + *pnEdges + (*(uint *)&pObj->pFanin1 & 1);
    *pnNodes = *pnNodes + 1;
  }
  return;
}

Assistant:

static inline int          Aig_ObjIsCi( Aig_Obj_t * pObj )        { return pObj->Type == AIG_OBJ_CI;     }